

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkFixCoDriverProblem(Abc_Obj_t *pDriver,Abc_Obj_t *pNodeCo,int fDuplicate)

{
  Abc_Ntk_t *pNtkNew;
  uint uVar1;
  Abc_Obj_t *pObj;
  long lVar2;
  
  pNtkNew = pDriver->pNtk;
  if (((fDuplicate == 0) || (uVar1 = *(uint *)&pDriver->field_0x14 & 0xf, uVar1 == 2)) ||
     (uVar1 == 5)) {
    if ((pNodeCo->field_0x15 & 4) == 0) {
      pObj = Abc_NtkCreateNodeBuf(pNtkNew,pDriver);
      goto LAB_001f0d33;
    }
    pObj = Abc_NtkCreateNodeInv(pNtkNew,pDriver);
  }
  else {
    pObj = Abc_NtkDupObj(pNtkNew,pDriver,0);
    if (0 < (pDriver->vFanins).nSize) {
      lVar2 = 0;
      do {
        Abc_ObjAddFanin(pObj,(Abc_Obj_t *)
                             pDriver->pNtk->vObjs->pArray[(pDriver->vFanins).pArray[lVar2]]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (pDriver->vFanins).nSize);
    }
    if ((pNodeCo->field_0x15 & 4) == 0) goto LAB_001f0d33;
    Abc_NodeComplement(pObj);
  }
  pNodeCo->field_0x15 = pNodeCo->field_0x15 ^ 4;
LAB_001f0d33:
  Abc_ObjPatchFanin(pNodeCo,pDriver,pObj);
  if ((pObj->vFanouts).nSize != 1) {
    __assert_fail("Abc_ObjFanoutNum(pDriverNew) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,899,"void Abc_NtkFixCoDriverProblem(Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pDriver->vFanouts).nSize != 0) {
    return;
  }
  Abc_NtkDeleteObj(pDriver);
  return;
}

Assistant:

void Abc_NtkFixCoDriverProblem( Abc_Obj_t * pDriver, Abc_Obj_t * pNodeCo, int fDuplicate )
{
    Abc_Ntk_t * pNtk = pDriver->pNtk;
    Abc_Obj_t * pDriverNew, * pFanin;
    int k;
    if ( fDuplicate && !Abc_ObjIsCi(pDriver) )
    {
        pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
        Abc_ObjForEachFanin( pDriver, pFanin, k )
            Abc_ObjAddFanin( pDriverNew, pFanin );
        if ( Abc_ObjFaninC0(pNodeCo) )
        {
            // change polarity of the duplicated driver
            Abc_NodeComplement( pDriverNew );
            Abc_ObjXorFaninC( pNodeCo, 0 );
        }
    }
    else
    {
        // add inverters and buffers when necessary
        if ( Abc_ObjFaninC0(pNodeCo) )
        {
            pDriverNew = Abc_NtkCreateNodeInv( pNtk, pDriver );
            Abc_ObjXorFaninC( pNodeCo, 0 );
        }
        else
            pDriverNew = Abc_NtkCreateNodeBuf( pNtk, pDriver );        
    }
    // update the fanin of the PO node
    Abc_ObjPatchFanin( pNodeCo, pDriver, pDriverNew );
    assert( Abc_ObjFanoutNum(pDriverNew) == 1 );
    // remove the old driver if it dangles
    // (this happens when the duplicated driver had only one complemented fanout)
    if ( Abc_ObjFanoutNum(pDriver) == 0 )
        Abc_NtkDeleteObj( pDriver );
}